

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# overflow.h
# Opt level: O0

optional<long> CheckedAdd<long>(long i,long j)

{
  long lVar1;
  bool bVar2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar3;
  long in_FS_OFFSET;
  optional<long> oVar4;
  long *in_stack_ffffffffffffffc0;
  optional<long> *in_stack_ffffffffffffffc8;
  long in_stack_ffffffffffffffe0;
  _Storage<long,_true> in_stack_ffffffffffffffe8;
  bool local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = AdditionOverflow<long>(in_stack_ffffffffffffffe8._M_value,in_stack_ffffffffffffffe0);
  if (bVar2) {
    std::optional<long>::optional((optional<long> *)&stack0xffffffffffffffe8);
    uVar3 = extraout_RDX;
  }
  else {
    std::optional<long>::optional<long,_true>(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    uVar3 = extraout_RDX_00;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    oVar4.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._9_7_
         = (undefined7)((ulong)uVar3 >> 8);
    oVar4.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_engaged = local_10;
    oVar4.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_payload._M_value = in_stack_ffffffffffffffe8._M_value;
    return (optional<long>)
           oVar4.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>;
  }
  __stack_chk_fail();
}

Assistant:

[[nodiscard]] std::optional<T> CheckedAdd(const T i, const T j) noexcept
{
    if (AdditionOverflow(i, j)) {
        return std::nullopt;
    }
    return i + j;
}